

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<SAT::SATLiteral>::loadFromIterator<Lib::Stack<SAT::SATLiteral>::BottomFirstIterator>
          (Stack<SAT::SATLiteral> *this,BottomFirstIterator it)

{
  anon_union_4_2_6ac8864f_for_SATLiteral_0 aVar1;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 *paVar2;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 *paVar3;
  
  paVar3 = &(it._pointer)->field_0;
  if (paVar3 != &(it._afterLast)->field_0) {
    paVar2 = &this->_cursor->field_0;
    do {
      aVar1 = *paVar3;
      if (paVar2 == &this->_end->field_0) {
        expand(this);
        paVar2 = &this->_cursor->field_0;
      }
      paVar3 = paVar3 + 1;
      *paVar2 = aVar1;
      paVar2 = &this->_cursor[1].field_0;
      this->_cursor = (SATLiteral *)paVar2;
    } while (paVar3 != &(it._afterLast)->field_0);
  }
  return;
}

Assistant:

inline
    bool hasNext() const
    {
      ASS_LE(_pointer, _afterLast);
      return _pointer != _afterLast;
    }